

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O1

void deqp::gles3::Functional::eval_leftShiftVecScalar_ivec2(ShaderEvalContext *c)

{
  float fVar1;
  int i;
  long lVar2;
  int i_1;
  Vector<int,_2> res;
  Vector<int,_2> result;
  Vector<float,_2> res_1;
  float local_18 [2];
  Vec4 *local_10;
  int local_8 [2];
  
  local_18[0] = c->in[0].m_data[3];
  local_18[1] = c->in[0].m_data[1];
  res.m_data[0] = 0;
  res.m_data[1] = 0;
  lVar2 = 0;
  do {
    res.m_data[lVar2] = (int)local_18[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  fVar1 = c->in[1].m_data[0];
  lVar2 = 0;
  do {
    *(int *)((long)&local_10 + lVar2 * 4) = (int)fVar1;
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  result.m_data[0] = 0;
  result.m_data[1] = 0;
  lVar2 = 0;
  do {
    result.m_data[lVar2] = res.m_data[lVar2] << (*(byte *)((long)&local_10 + lVar2 * 4) & 0x1f);
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  res_1.m_data[0] = 0.0;
  res_1.m_data[1] = 0.0;
  lVar2 = 0;
  do {
    res_1.m_data[lVar2] = (float)result.m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  local_10 = &c->color;
  local_8[0] = 1;
  local_8[1] = 2;
  lVar2 = 0;
  do {
    (c->color).m_data[local_8[lVar2]] = res_1.m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  return;
}

Assistant:

Vector<T, 2>			swizzle		(int a, int b) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); return Vector<T, 2>(m_data[a], m_data[b]); }